

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_p384(mbedtls_mpi *N)

{
  ulong uVar1;
  ulong *puVar2;
  mbedtls_mpi_uint *pmVar3;
  int iVar4;
  byte c;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [7];
  
  C.s = 1;
  C.n = 7;
  C.p = Cp;
  Cp[0] = 0;
  Cp[1] = 0;
  Cp[2] = 0;
  Cp[3] = 0;
  Cp[4] = 0;
  Cp[5] = 0;
  Cp[6] = 0;
  iVar4 = mbedtls_mpi_grow(N,0xc);
  if (iVar4 == 0) {
    pmVar3 = N->p;
    uVar27 = pmVar3[6];
    uVar6 = (uint)uVar27;
    uVar5 = (uint)*pmVar3;
    uVar11 = uVar6 + uVar5;
    uVar10 = (uint)(pmVar3[10] >> 0x20);
    uVar12 = uVar11 + uVar10;
    uVar8 = (uint)pmVar3[10];
    uVar13 = uVar12 + uVar8;
    uVar9 = (uint)(pmVar3[0xb] >> 0x20);
    cVar15 = (CARRY4(uVar11,uVar10) + CARRY4(uVar6,uVar5) + CARRY4(uVar12,uVar8)) - (uVar13 < uVar9)
    ;
    uVar11 = (uint)cVar15;
    uVar5 = (uint)(*pmVar3 >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar5 < -uVar11);
    }
    else {
      cVar15 = CARRY4(uVar11,uVar5);
    }
    uVar26 = (uint)(uVar27 >> 0x20);
    uVar16 = uVar11 + uVar5 + uVar26;
    uVar12 = (uint)pmVar3[0xb];
    uVar17 = uVar16 + uVar12;
    uVar18 = uVar17 + uVar9;
    uVar19 = uVar18 - uVar6;
    cVar15 = ((CARRY4(uVar16,uVar12) + cVar15 + CARRY4(uVar11 + uVar5,uVar26) + CARRY4(uVar17,uVar9)
              ) - (uVar18 < uVar6)) - (uVar19 < uVar8);
    *pmVar3 = CONCAT44(uVar19 - uVar8,uVar13 - uVar9);
    uVar11 = (uint)cVar15;
    uVar5 = (uint)pmVar3[1];
    if (cVar15 < '\0') {
      cVar15 = -(uVar5 < -uVar11);
    }
    else {
      cVar15 = CARRY4(uVar11,uVar5);
    }
    uVar13 = (uint)pmVar3[7];
    uVar16 = uVar11 + uVar5 + uVar13;
    uVar17 = uVar16 + uVar9;
    uVar18 = uVar17 - uVar26;
    cVar15 = ((CARRY4(uVar11 + uVar5,uVar13) + cVar15 + CARRY4(uVar16,uVar9)) - (uVar17 < uVar26)) -
             (uVar18 < uVar10);
    uVar11 = (uint)cVar15;
    uVar5 = (uint)(pmVar3[1] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar5 < -uVar11);
    }
    else {
      cVar15 = CARRY4(uVar11,uVar5);
    }
    uVar16 = (uint)(pmVar3[7] >> 0x20);
    uVar17 = uVar11 + uVar5 + uVar16;
    uVar19 = uVar17 + uVar6;
    uVar20 = uVar19 + uVar8;
    uVar21 = uVar20 + uVar10;
    uVar22 = uVar21 - uVar13;
    uVar23 = uVar22 - uVar12;
    cVar15 = (((CARRY4(uVar19,uVar8) + CARRY4(uVar11 + uVar5,uVar16) + cVar15 + CARRY4(uVar17,uVar6)
               + CARRY4(uVar20,uVar10)) - (uVar21 < uVar13)) - (uVar22 < uVar12)) - (uVar23 < uVar9)
    ;
    pmVar3[1] = CONCAT44(uVar23 - uVar9,uVar18 - uVar10);
    uVar11 = (uint)cVar15;
    uVar5 = (uint)pmVar3[2];
    if (cVar15 < '\0') {
      cVar15 = -(uVar5 < -uVar11);
    }
    else {
      cVar15 = CARRY4(uVar11,uVar5);
    }
    uVar17 = uVar11 + uVar5 + uVar10;
    uVar18 = uVar17 + uVar10;
    uVar28 = (uint)pmVar3[8];
    uVar19 = uVar18 + uVar28;
    uVar20 = uVar19 + uVar26;
    uVar21 = uVar20 + uVar6;
    uVar22 = uVar21 + uVar8;
    uVar23 = uVar22 + uVar12;
    uVar24 = uVar23 - uVar16;
    uVar25 = uVar24 - uVar9;
    cVar15 = (((CARRY4(uVar21,uVar8) +
                CARRY4(uVar19,uVar26) +
                CARRY4(uVar17,uVar10) + cVar15 + CARRY4(uVar11 + uVar5,uVar10) +
                CARRY4(uVar18,uVar28) + CARRY4(uVar20,uVar6) + CARRY4(uVar22,uVar12)) -
              (uVar23 < uVar16)) - (uVar24 < uVar9)) - (uVar25 < uVar9);
    uVar5 = (uint)cVar15;
    uVar11 = (uint)(pmVar3[2] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar11 < -uVar5);
    }
    else {
      cVar15 = CARRY4(uVar5,uVar11);
    }
    uVar6 = uVar5 + uVar11 + uVar12;
    uVar17 = uVar6 + uVar12;
    uVar23 = (uint)(pmVar3[8] >> 0x20);
    uVar18 = uVar17 + uVar23;
    uVar19 = uVar18 + uVar13;
    uVar20 = uVar19 + uVar26;
    uVar21 = uVar20 + uVar10;
    uVar22 = uVar21 + uVar9;
    cVar15 = (CARRY4(uVar20,uVar10) +
              CARRY4(uVar18,uVar13) +
              CARRY4(uVar6,uVar12) + cVar15 + CARRY4(uVar5 + uVar11,uVar12) + CARRY4(uVar17,uVar23)
              + CARRY4(uVar19,uVar26) + CARRY4(uVar21,uVar9)) - (uVar22 < uVar28);
    pmVar3[2] = CONCAT44(uVar22 - uVar28,uVar25 - uVar9);
    uVar11 = (uint)cVar15;
    uVar5 = (uint)pmVar3[3];
    if (cVar15 < '\0') {
      cVar15 = -(uVar5 < -uVar11);
    }
    else {
      cVar15 = CARRY4(uVar11,uVar5);
    }
    uVar17 = uVar11 + uVar5 + uVar9;
    uVar18 = uVar17 + uVar9;
    uVar6 = (uint)pmVar3[9];
    uVar19 = uVar18 + uVar6;
    uVar26 = uVar19 + uVar16;
    uVar20 = uVar26 + uVar13;
    uVar21 = uVar20 + uVar12;
    cVar15 = (CARRY4(uVar26,uVar13) +
              CARRY4(uVar18,uVar6) + CARRY4(uVar11 + uVar5,uVar9) + cVar15 + CARRY4(uVar17,uVar9) +
              CARRY4(uVar19,uVar16) + CARRY4(uVar20,uVar12)) - (uVar21 < uVar23);
    uVar5 = (uint)cVar15;
    uVar11 = (uint)(pmVar3[3] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar11 < -uVar5);
    }
    else {
      cVar15 = CARRY4(uVar5,uVar11);
    }
    uVar26 = (uint)(pmVar3[9] >> 0x20);
    uVar13 = uVar5 + uVar11 + uVar26;
    uVar17 = uVar13 + uVar28;
    uVar18 = uVar17 + uVar16;
    uVar19 = uVar18 + uVar9;
    cVar15 = (CARRY4(uVar17,uVar16) + CARRY4(uVar5 + uVar11,uVar26) + cVar15 + CARRY4(uVar13,uVar28)
             + CARRY4(uVar18,uVar9)) - (uVar19 < uVar6);
    pmVar3[3] = CONCAT44(uVar19 - uVar6,uVar21 - uVar23);
    uVar5 = (uint)cVar15;
    uVar11 = (uint)pmVar3[4];
    if (cVar15 < '\0') {
      cVar15 = -(uVar11 < -uVar5);
    }
    else {
      cVar15 = CARRY4(uVar5,uVar11);
    }
    uVar13 = uVar5 + uVar11 + uVar8;
    uVar16 = uVar13 + uVar23;
    uVar17 = uVar16 + uVar28;
    cVar15 = (CARRY4(uVar13,uVar23) + cVar15 + CARRY4(uVar5 + uVar11,uVar8) + CARRY4(uVar16,uVar28))
             - (uVar17 < uVar26);
    uVar5 = (uint)cVar15;
    uVar11 = (uint)(pmVar3[4] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar11 < -uVar5);
    }
    else {
      cVar15 = CARRY4(uVar5,uVar11);
    }
    uVar13 = uVar5 + uVar11 + uVar10;
    uVar16 = uVar13 + uVar6;
    uVar18 = uVar16 + uVar23;
    cVar15 = (CARRY4(uVar13,uVar6) + cVar15 + CARRY4(uVar5 + uVar11,uVar10) + CARRY4(uVar16,uVar23))
             - (uVar18 < uVar8);
    pmVar3[4] = CONCAT44(uVar18 - uVar8,uVar17 - uVar26);
    uVar5 = (uint)cVar15;
    uVar11 = (uint)pmVar3[5];
    if (cVar15 < '\0') {
      cVar15 = -(uVar11 < -uVar5);
    }
    else {
      cVar15 = CARRY4(uVar5,uVar11);
    }
    uVar13 = uVar5 + uVar11 + uVar12;
    uVar16 = uVar13 + uVar26;
    uVar17 = uVar16 + uVar6;
    cVar15 = (CARRY4(uVar13,uVar26) + cVar15 + CARRY4(uVar5 + uVar11,uVar12) + CARRY4(uVar16,uVar6))
             - (uVar17 < uVar10);
    uVar5 = (uint)cVar15;
    uVar11 = (uint)(pmVar3[5] >> 0x20);
    if (cVar15 < '\0') {
      cVar15 = -(uVar11 < -uVar5);
    }
    else {
      cVar15 = CARRY4(uVar5,uVar11);
    }
    uVar13 = uVar5 + uVar11 + uVar9;
    uVar6 = uVar13 + uVar8;
    uVar16 = uVar6 + uVar26;
    c = (CARRY4(uVar13,uVar8) + cVar15 + CARRY4(uVar5 + uVar11,uVar9) + CARRY4(uVar6,uVar26)) -
        (uVar16 < uVar12);
    pmVar3[5] = CONCAT44(uVar16 - uVar12,uVar17 - uVar10);
    bVar7 = 0;
    if ('\0' < (char)c) {
      bVar7 = c;
    }
    pmVar3[6] = (ulong)bVar7 | uVar27 & 0xffffffff00000000;
    uVar27 = 0xc;
    while (uVar1 = uVar27 + 1, uVar1 < N->n * 2) {
      uVar14 = 0xffffffff00000000;
      if ((uVar27 & 1) == 0) {
        uVar14 = 0xffffffff;
      }
      puVar2 = (ulong *)((long)pmVar3 + (uVar1 & 0xfffffffffffffffe) * 4);
      *puVar2 = *puVar2 & uVar14;
      uVar27 = uVar1;
    }
    if ((char)c < '\0') {
      fix_negative(N,c,&C,0x180);
    }
  }
  return iVar4;
}

Assistant:

static int ecp_mod_p384( mbedtls_mpi *N )
{
    INIT( 384 );

    ADD( 12 ); ADD( 21 ); ADD( 20 );
    SUB( 23 );                                              NEXT; // A0

    ADD( 13 ); ADD( 22 ); ADD( 23 );
    SUB( 12 ); SUB( 20 );                                   NEXT; // A2

    ADD( 14 ); ADD( 23 );
    SUB( 13 ); SUB( 21 );                                   NEXT; // A2

    ADD( 15 ); ADD( 12 ); ADD( 20 ); ADD( 21 );
    SUB( 14 ); SUB( 22 ); SUB( 23 );                        NEXT; // A3

    ADD( 21 ); ADD( 21 ); ADD( 16 ); ADD( 13 ); ADD( 12 ); ADD( 20 ); ADD( 22 );
    SUB( 15 ); SUB( 23 ); SUB( 23 );                        NEXT; // A4

    ADD( 22 ); ADD( 22 ); ADD( 17 ); ADD( 14 ); ADD( 13 ); ADD( 21 ); ADD( 23 );
    SUB( 16 );                                              NEXT; // A5

    ADD( 23 ); ADD( 23 ); ADD( 18 ); ADD( 15 ); ADD( 14 ); ADD( 22 );
    SUB( 17 );                                              NEXT; // A6

    ADD( 19 ); ADD( 16 ); ADD( 15 ); ADD( 23 );
    SUB( 18 );                                              NEXT; // A7

    ADD( 20 ); ADD( 17 ); ADD( 16 );
    SUB( 19 );                                              NEXT; // A8

    ADD( 21 ); ADD( 18 ); ADD( 17 );
    SUB( 20 );                                              NEXT; // A9

    ADD( 22 ); ADD( 19 ); ADD( 18 );
    SUB( 21 );                                              NEXT; // A10

    ADD( 23 ); ADD( 20 ); ADD( 19 );
    SUB( 22 );                                              LAST; // A11

cleanup:
    return( ret );
}